

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void spr_write_ebb(DisasContext_conflict10 *ctx,int sprn,int gprn)

{
  TCGContext_conflict10 *tcg_ctx;
  int in_R8D;
  
  gen_fscr_facility_check(ctx,7,sprn,7,in_R8D);
  tcg_ctx = ctx->uc->tcg_ctx;
  tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_st_i64,(TCGArg)((long)&tcg_ctx->pool_cur + (long)cpu_gpr[gprn])
                    ,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(long)sprn * 8 + 0xb18);
  return;
}

Assistant:

static void spr_write_ebb(DisasContext *ctx, int sprn, int gprn)
{
    gen_fscr_facility_check(ctx, SPR_FSCR, FSCR_EBB, sprn, FSCR_IC_EBB);
    spr_write_generic(ctx, sprn, gprn);
}